

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,QByteArrayView before,QByteArrayView after)

{
  char *pcVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  size_t __n2;
  _Alloc_hider __s;
  long lVar7;
  char *pcVar8;
  size_t __n;
  long lVar9;
  size_type __n2_00;
  _Alloc_hider __s_00;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QByteArrayView data;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  QByteArrayView data_03;
  size_t indices [4096];
  QByteArrayMatcher matcher;
  long local_84e0;
  qsizetype local_8498 [4096];
  QByteArrayMatcher local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  __s_00._M_p = after.m_data;
  __n2 = after.m_size;
  __s._M_p = before.m_data;
  __n2_00 = before.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->d).size;
  if (lVar4 == 0) {
    if (__n2_00 != 0) goto LAB_00156d99;
  }
  else if (__n2 == __n2_00 && __s._M_p == __s_00._M_p) goto LAB_00156d99;
  if (__n2 != 0 || __n2_00 != 0) {
    if (__n2 == 1 && __n2_00 == 1) {
      replace(this,*__s._M_p,*__s_00._M_p);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      pcVar1 = (this->d).ptr;
      if (__s_00._M_p < pcVar1 + lVar4 && pcVar1 <= __s_00._M_p) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (&local_78,0,0,__s_00._M_p,__n2);
        __s_00._M_p = local_78._M_dataplus._M_p;
      }
      pcVar1 = (this->d).ptr;
      if ((pcVar1 <= __s._M_p) && (__s._M_p < pcVar1 + (this->d).size)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (&local_58,0,local_58._M_string_length,__s._M_p,__n2_00);
        __s._M_p = local_58._M_dataplus._M_p;
      }
      memset(&local_498,0xaa,0x420);
      QByteArrayMatcher::QByteArrayMatcher(&local_498,__s._M_p,__n2_00);
      pDVar2 = (this->d).d;
      qVar5 = (this->d).size;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        reallocData(this,qVar5,KeepSize);
      }
      pcVar1 = (this->d).ptr;
      lVar4 = __n2 - __n2_00;
      if (lVar4 == 0) {
        if ((__n2_00 != 0) &&
           (data.m_data = (this->d).ptr, data.m_size = (this->d).size,
           qVar5 = QByteArrayMatcher::indexIn(&local_498,data,0), qVar5 != -1)) {
          do {
            memcpy(pcVar1 + qVar5,__s_00._M_p,__n2);
            data_00.m_data = (this->d).ptr;
            data_00.m_size = (this->d).size;
            qVar5 = QByteArrayMatcher::indexIn(&local_498,data_00,qVar5 + __n2_00);
          } while (qVar5 != -1);
        }
      }
      else if ((long)__n2 < (long)__n2_00) {
        lVar10 = 0;
        data_01.m_data = (this->d).ptr;
        data_01.m_size = (this->d).size;
        qVar6 = QByteArrayMatcher::indexIn(&local_498,data_01,0);
        local_84e0 = 0;
        lVar11 = 0;
        if (qVar6 != -1) {
          lVar10 = 0;
          lVar11 = 0;
          local_84e0 = 0;
          do {
            bVar12 = lVar10 != 0;
            lVar10 = lVar10 + -1;
            lVar9 = qVar6;
            if ((bVar12) && (__n = qVar6 - lVar11, lVar9 = local_84e0, 0 < (long)__n)) {
              memmove(pcVar1 + local_84e0,pcVar1 + lVar11,__n);
              lVar9 = __n + local_84e0;
            }
            if (0 < (long)__n2) {
              memcpy(pcVar1 + lVar9,__s_00._M_p,__n2);
              lVar9 = lVar9 + __n2;
            }
            lVar11 = qVar6 + __n2_00;
            data_02.m_data = (this->d).ptr;
            data_02.m_size = (this->d).size;
            qVar6 = QByteArrayMatcher::indexIn(&local_498,data_02,lVar11);
            local_84e0 = lVar9;
          } while (qVar6 != -1);
          lVar10 = -lVar10;
        }
        if (lVar10 != 0) {
          if (0 < qVar5 - lVar11) {
            memmove(pcVar1 + local_84e0,pcVar1 + lVar11,qVar5 - lVar11);
          }
          resize(this,lVar10 * lVar4 + qVar5);
        }
      }
      else {
        lVar10 = 0;
        do {
          if (lVar10 == -1) break;
          memset(local_8498,0xaa,0x8000);
          lVar11 = 0;
          do {
            data_03.m_data = (this->d).ptr;
            data_03.m_size = (this->d).size;
            qVar6 = QByteArrayMatcher::indexIn(&local_498,data_03,lVar10);
            if (qVar6 == -1) {
              lVar10 = -1;
              goto LAB_00156c8c;
            }
            local_8498[lVar11] = qVar6;
            lVar11 = lVar11 + 1;
            lVar10 = qVar6 + __n2_00 + (__n2_00 == 0);
          } while (lVar11 != 0xfff);
          lVar11 = 0xfff;
LAB_00156c8c:
          lVar9 = qVar5;
          if (lVar11 != 0) {
            lVar7 = lVar11 * lVar4;
            if (lVar10 != -1) {
              lVar10 = lVar7 + lVar10;
            }
            if (0 < lVar7) {
              lVar9 = lVar7 + qVar5;
              resize(this,lVar9);
            }
            pcVar1 = (this->d).ptr;
            pcVar8 = pcVar1 + (lVar11 + -1) * lVar4;
            lVar7 = lVar11;
            do {
              lVar3 = local_8498[lVar7 + -1];
              memmove(pcVar8 + lVar3 + __n2,pcVar1 + __n2_00 + lVar3,qVar5 - (__n2_00 + lVar3));
              if (__n2 != 0) {
                memcpy(pcVar8 + lVar3,__s_00._M_p,__n2);
              }
              lVar7 = lVar7 + -1;
              pcVar8 = pcVar8 + (__n2_00 - __n2);
              qVar5 = lVar3;
            } while (lVar7 != 0);
          }
          qVar5 = lVar9;
        } while (lVar11 != 0);
      }
      QByteArrayMatcher::~QByteArrayMatcher(&local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00156d99:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QByteArray &QByteArray::replace(QByteArrayView before, QByteArrayView after)
{
    const char *b = before.data();
    qsizetype bsize = before.size();
    const char *a = after.data();
    qsizetype asize = after.size();

    if (isEmpty()) {
        if (bsize)
            return *this;
    } else {
        if (b == a && bsize == asize)
            return *this;
    }
    if (asize == 0 && bsize == 0)
        return *this;

    if (bsize == 1 && asize == 1)
        return replace(*b, *a); // use the fast char-char algorithm

    // protect against before or after being part of this
    std::string pinnedNeedle, pinnedReplacement;
    if (QtPrivate::q_points_into_range(a, d)) {
        pinnedReplacement.assign(a, a + asize);
        a = pinnedReplacement.data();
    }
    if (QtPrivate::q_points_into_range(b, d)) {
        pinnedNeedle.assign(b, b + bsize);
        b = pinnedNeedle.data();
    }

    QByteArrayMatcher matcher(b, bsize);
    qsizetype index = 0;
    qsizetype len = size();
    char *d = data(); // detaches

    if (bsize == asize) {
        if (bsize) {
            while ((index = matcher.indexIn(*this, index)) != -1) {
                memcpy(d + index, a, asize);
                index += bsize;
            }
        }
    } else if (asize < bsize) {
        size_t to = 0;
        size_t movestart = 0;
        size_t num = 0;
        while ((index = matcher.indexIn(*this, index)) != -1) {
            if (num) {
                qsizetype msize = index - movestart;
                if (msize > 0) {
                    memmove(d + to, d + movestart, msize);
                    to += msize;
                }
            } else {
                to = index;
            }
            if (asize > 0) {
                memcpy(d + to, a, asize);
                to += asize;
            }
            index += bsize;
            movestart = index;
            num++;
        }
        if (num) {
            qsizetype msize = len - movestart;
            if (msize > 0)
                memmove(d + to, d + movestart, msize);
            resize(len - num*(bsize-asize));
        }
    } else {
        // the most complex case. We don't want to lose performance by doing repeated
        // copies and reallocs of the data.
        while (index != -1) {
            size_t indices[4096];
            size_t pos = 0;
            while(pos < 4095) {
                index = matcher.indexIn(*this, index);
                if (index == -1)
                    break;
                indices[pos++] = index;
                index += bsize;
                // avoid infinite loop
                if (!bsize)
                    index++;
            }
            if (!pos)
                break;

            // we have a table of replacement positions, use them for fast replacing
            qsizetype adjust = pos*(asize-bsize);
            // index has to be adjusted in case we get back into the loop above.
            if (index != -1)
                index += adjust;
            qsizetype newlen = len + adjust;
            qsizetype moveend = len;
            if (newlen > len) {
                resize(newlen);
                len = newlen;
            }
            d = this->d.data(); // data(), without the detach() check

            while(pos) {
                pos--;
                qsizetype movestart = indices[pos] + bsize;
                qsizetype insertstart = indices[pos] + pos*(asize-bsize);
                qsizetype moveto = insertstart + asize;
                memmove(d + moveto, d + movestart, (moveend - movestart));
                if (asize)
                    memcpy(d + insertstart, a, asize);
                moveend = movestart - bsize;
            }
        }
    }
    return *this;
}